

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_attn_cross::set_input(llm_graph_input_attn_cross *this,llama_ubatch *ubatch)

{
  ggml_tensor *pgVar1;
  char cVar2;
  const_iterator cVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  int s;
  long lVar9;
  float f;
  llama_seq_id seq_id;
  undefined4 local_68;
  llama_seq_id local_64;
  void *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  pgVar1 = this->cross_kq_mask;
  if (pgVar1 == (ggml_tensor *)0x0) {
    return;
  }
  lVar4 = pgVar1->ne[0];
  local_50 = (ulong)ubatch->n_tokens;
  cVar2 = ggml_backend_buffer_is_host(pgVar1->buffer);
  if (cVar2 == '\0') {
    pcVar5 = "ggml_backend_buffer_is_host(cross_kq_mask->buffer)";
    uVar8 = 0x209;
  }
  else {
    if (ubatch->equal_seqs != true) {
      local_60 = this->cross_kq_mask->data;
      uVar6 = 0;
      lVar9 = 0;
      if (0 < lVar4) {
        lVar9 = lVar4;
      }
      local_58 = lVar4;
      local_48 = lVar9;
      for (; uVar6 != local_50; uVar6 = uVar6 + 1) {
        local_40 = (void *)((long)local_60 + local_58 * uVar6 * 4);
        lVar4 = 0;
        while (lVar4 != lVar9) {
          local_68 = 0xff800000;
          local_38 = lVar4;
          for (lVar9 = 0; lVar9 < ubatch->n_seq_id[uVar6]; lVar9 = lVar9 + 1) {
            local_64 = ubatch->seq_id[uVar6][lVar9];
            cVar3 = std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    find(&(this->cross->seq_ids_enc).
                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t,&local_64);
            if (cVar3._M_node !=
                &(this->cross->seq_ids_enc).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t._M_impl.super__Rb_tree_header
                 ._M_header) {
              local_68 = 0;
            }
          }
          *(undefined4 *)((long)local_40 + local_38 * 4) = local_68;
          lVar9 = local_48;
          lVar4 = local_38 + 1;
        }
      }
      lVar4 = (long)(int)local_50;
      local_60 = (void *)((long)local_60 + local_58 * lVar4 * 4);
      for (; lVar4 < (long)(local_50 + 0x3f & 0xffffffffffffffc0); lVar4 = lVar4 + 1) {
        for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
          *(undefined4 *)((long)local_60 + lVar7 * 4) = 0xff800000;
        }
        local_60 = (void *)((long)local_60 + local_58 * 4);
      }
      return;
    }
    pcVar5 = "!ubatch->equal_seqs";
    uVar8 = 0x20a;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

void llm_graph_input_attn_cross::set_input(const llama_ubatch * ubatch) {
    if (cross_kq_mask) {
        const int64_t n_enc    = cross_kq_mask->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(cross_kq_mask->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        float * data = (float *) cross_kq_mask->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_enc; ++i) {
                    float f = -INFINITY;
                    for (int s = 0; s < ubatch->n_seq_id[j]; ++s) {
                        const llama_seq_id seq_id = ubatch->seq_id[j][s];
                        if (cross->seq_ids_enc[i].find(seq_id) != cross->seq_ids_enc[i].end()) {
                            f = 0.0f;
                        }
                    }
                    data[h*(n_enc*n_tokens) + j*n_enc + i] = f;
                }
            }

            for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                for (int j = 0; j < n_enc; ++j) {
                    data[h*(n_enc*n_tokens) + i*n_enc + j] = -INFINITY;
                }
            }
        }
    }
}